

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O3

void __thiscall sf::Shape::update(Shape *this)

{
  VertexBuffer *pVVar1;
  float fVar2;
  float fVar3;
  Color CVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  size_t sVar8;
  Vertex *pVVar9;
  Vertex *pVVar10;
  size_t sVar11;
  VertexArray *pVVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  FloatRect FVar13;
  Vector2f local_38;
  ulong uVar7;
  
  iVar6 = (*(this->super_Drawable)._vptr_Drawable[3])();
  uVar7 = CONCAT44(extraout_var,iVar6);
  pVVar12 = &this->m_vertices;
  if (uVar7 < 3) {
    VertexArray::resize(pVVar12,0);
    VertexArray::resize(&this->m_outlineVertices,0);
    bVar5 = VertexBuffer::isAvailable();
    if (bVar5) {
      sVar8 = VertexBuffer::getVertexCount(&this->m_verticesBuffer);
      if (sVar8 != 0) {
        VertexBuffer::create(&this->m_verticesBuffer,0);
      }
      sVar8 = VertexBuffer::getVertexCount(&this->m_outlineVerticesBuffer);
      if (sVar8 != 0) {
        VertexBuffer::create(&this->m_outlineVerticesBuffer,0);
        return;
      }
    }
  }
  else {
    VertexArray::resize(pVVar12,uVar7 + 2);
    sVar8 = 0;
    do {
      (*(this->super_Drawable)._vptr_Drawable[4])(this,sVar8);
      local_38.y = extraout_XMM0_Db;
      local_38.x = extraout_XMM0_Da;
      sVar8 = sVar8 + 1;
      pVVar9 = VertexArray::operator[](pVVar12,sVar8);
      pVVar9->position = local_38;
    } while (uVar7 != sVar8);
    pVVar9 = VertexArray::operator[](pVVar12,1);
    pVVar10 = VertexArray::operator[](pVVar12,uVar7 + 1);
    pVVar10->position = pVVar9->position;
    pVVar9 = VertexArray::operator[](pVVar12,1);
    pVVar10 = VertexArray::operator[](pVVar12,0);
    CVar4 = pVVar9->color;
    fVar2 = (pVVar9->texCoords).x;
    pVVar10->position = pVVar9->position;
    pVVar10->color = CVar4;
    (pVVar10->texCoords).x = fVar2;
    (pVVar10->texCoords).y = (pVVar9->texCoords).y;
    FVar13 = VertexArray::getBounds(pVVar12);
    this->m_insideBounds = FVar13;
    pVVar9 = VertexArray::operator[](pVVar12,0);
    (pVVar9->position).x = FVar13.width * 0.5 + FVar13.left;
    fVar2 = (this->m_insideBounds).height;
    fVar3 = (this->m_insideBounds).top;
    pVVar9 = VertexArray::operator[](pVVar12,0);
    (pVVar9->position).y = fVar2 * 0.5 + fVar3;
    updateFillColors(this);
    updateTexCoords(this);
    updateOutline(this);
    bVar5 = VertexBuffer::isAvailable();
    if (bVar5) {
      pVVar1 = &this->m_verticesBuffer;
      sVar8 = VertexBuffer::getVertexCount(pVVar1);
      sVar11 = VertexArray::getVertexCount(pVVar12);
      if (sVar8 != sVar11) {
        sVar8 = VertexArray::getVertexCount(pVVar12);
        VertexBuffer::create(pVVar1,sVar8);
      }
      pVVar9 = VertexArray::operator[](pVVar12,0);
      VertexBuffer::update(pVVar1,pVVar9);
      pVVar1 = &this->m_outlineVerticesBuffer;
      sVar8 = VertexBuffer::getVertexCount(pVVar1);
      pVVar12 = &this->m_outlineVertices;
      sVar11 = VertexArray::getVertexCount(pVVar12);
      if (sVar8 != sVar11) {
        sVar8 = VertexArray::getVertexCount(pVVar12);
        VertexBuffer::create(pVVar1,sVar8);
      }
      sVar8 = VertexArray::getVertexCount(pVVar12);
      if (sVar8 != 0) {
        pVVar9 = VertexArray::operator[](pVVar12,0);
        VertexBuffer::update(pVVar1,pVVar9);
        return;
      }
    }
  }
  return;
}

Assistant:

void Shape::update()
{
    // Get the total number of points of the shape
    std::size_t count = getPointCount();
    if (count < 3)
    {
        m_vertices.resize(0);
        m_outlineVertices.resize(0);

        if (VertexBuffer::isAvailable())
        {
            if (m_verticesBuffer.getVertexCount())
                m_verticesBuffer.create(0);

            if (m_outlineVerticesBuffer.getVertexCount())
                m_outlineVerticesBuffer.create(0);
        }

        return;
    }

    m_vertices.resize(count + 2); // + 2 for center and repeated first point

    // Position
    for (std::size_t i = 0; i < count; ++i)
        m_vertices[i + 1].position = getPoint(i);
    m_vertices[count + 1].position = m_vertices[1].position;

    // Update the bounding rectangle
    m_vertices[0] = m_vertices[1]; // so that the result of getBounds() is correct
    m_insideBounds = m_vertices.getBounds();

    // Compute the center and make it the first vertex
    m_vertices[0].position.x = m_insideBounds.left + m_insideBounds.width / 2;
    m_vertices[0].position.y = m_insideBounds.top + m_insideBounds.height / 2;

    // Color
    updateFillColors();

    // Texture coordinates
    updateTexCoords();

    // Outline
    updateOutline();

    // Update the vertex buffers if they are being used
    if (VertexBuffer::isAvailable())
    {
        if (m_verticesBuffer.getVertexCount() != m_vertices.getVertexCount())
            m_verticesBuffer.create(m_vertices.getVertexCount());

        m_verticesBuffer.update(&m_vertices[0]);

        if (m_outlineVerticesBuffer.getVertexCount() != m_outlineVertices.getVertexCount())
            m_outlineVerticesBuffer.create(m_outlineVertices.getVertexCount());

        if (m_outlineVertices.getVertexCount())
            m_outlineVerticesBuffer.update(&m_outlineVertices[0]);
    }
}